

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

float __thiscall experimental::pdf(experimental *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Ray *ray_00;
  Vector3f *this_00;
  float fVar5;
  float fVar6;
  Vector3f spec;
  Vector3f diff;
  
  Vector3f::Vector3f(&diff,&h->material->_diffuseColor);
  this_00 = &spec;
  Vector3f::Vector3f(this_00,&h->material->_specularColor);
  pfVar4 = Vector3f::operator[](&diff,0);
  fVar5 = *pfVar4;
  pfVar4 = Vector3f::operator[](&diff,1);
  fVar6 = *pfVar4;
  pfVar4 = Vector3f::operator[](&diff,2);
  fVar1 = *pfVar4;
  pfVar4 = Vector3f::operator[](this_00,0);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::operator[](this_00,1);
  fVar3 = *pfVar4;
  ray_00 = (Ray *)0x2;
  pfVar4 = Vector3f::operator[](this_00,2);
  fVar6 = 1.0 / ((fVar5 + fVar6 + fVar1) / (fVar2 + fVar3 + *pfVar4) + 1.0);
  fVar5 = cosineWeightedHemisphere::pdf((cosineWeightedHemisphere *)this_00,ray_00,dir,h);
  return fVar5 * (1.0 - fVar6) + 0.0 + fVar6;
}

Assistant:

float experimental::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float pdf = 0;
    Sampler* sampler_diff = new cosineWeightedHemisphere;
    pdf += (1-prob_spec) * sampler_diff->pdf(ray, dir, h);
    Sampler* sampler_ref = new pureReflectance;
    pdf += prob_spec * sampler_ref->pdf(ray, dir, h);

    return pdf;
}